

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandCover(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nCubesMax;
  uint uVar2;
  Abc_Ntk_t *pAVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  
  pAVar3 = Abc_FrameReadNtk(pAbc);
  local_48 = 0;
  Extra_UtilGetoptReset();
  local_54 = 8;
  local_50 = 1;
  local_4c = 0;
  local_44 = 1;
  nCubesMax = 8;
LAB_0025c25a:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"IPsxivh");
    iVar6 = globalUtilOptind;
    if (iVar1 == 0x50) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-P\" should be followed by an integer.\n";
LAB_0025c36b:
        Abc_Print(-1,pcVar4);
        goto LAB_0025c377;
      }
      nCubesMax = atoi(argv[globalUtilOptind]);
      uVar2 = nCubesMax;
    }
    else {
      if (0x72 < iVar1) {
        if (iVar1 == 0x73) {
          local_50 = local_50 ^ 1;
        }
        else if (iVar1 == 0x76) {
          local_48 = local_48 ^ 1;
        }
        else {
          if (iVar1 != 0x78) goto LAB_0025c377;
          local_4c = local_4c ^ 1;
        }
        goto LAB_0025c25a;
      }
      if (iVar1 == -1) {
        if (pAVar3 == (Abc_Ntk_t *)0x0) {
          pcVar4 = "Empty network.\n";
        }
        else {
          if (pAVar3->ntkType == ABC_NTK_STRASH) {
            pAVar3 = Abc_NtkSopEsopCover(pAVar3,local_54,nCubesMax,local_4c,local_50,local_44,
                                         local_48);
            if (pAVar3 != (Abc_Ntk_t *)0x0) {
              Abc_FrameReplaceCurrentNetwork(pAbc,pAVar3);
              return 0;
            }
            Abc_Print(-1,"Command has failed.\n");
            return 0;
          }
          pcVar4 = "Only works for strashed networks.\n";
        }
        iVar6 = -1;
        goto LAB_0025c454;
      }
      if (iVar1 != 0x49) {
        if (iVar1 != 0x69) goto LAB_0025c377;
        local_44 = local_44 ^ 1;
        goto LAB_0025c25a;
      }
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-I\" should be followed by an integer.\n";
        goto LAB_0025c36b;
      }
      local_54 = atoi(argv[globalUtilOptind]);
      uVar2 = local_54;
    }
    globalUtilOptind = iVar6 + 1;
    if ((int)uVar2 < 0) {
LAB_0025c377:
      Abc_Print(-2,"usage: cover [-IP num] [-sxvh]\n");
      Abc_Print(-2,"\t         decomposition into a network of SOP/ESOP PLAs\n");
      Abc_Print(-2,"\t         (this command is known to have bugs)\n");
      Abc_Print(-2,"\t-I num : maximum number of inputs [default = %d]\n",(ulong)local_54);
      Abc_Print(-2,"\t-P num : maximum number of products [default = %d]\n",(ulong)nCubesMax);
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (local_50 == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-s     : toggle the use of SOPs [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_4c == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-x     : toggle the use of ESOPs [default = %s]\n",pcVar4);
      if (local_48 == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
      pcVar4 = "\t-h     : print the command usage\n";
      iVar6 = -2;
LAB_0025c454:
      Abc_Print(iVar6,pcVar4);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandCover( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c;
    int fVerbose;
    int fUseSop;
    int fUseEsop;
    int fUseInvs;
    int nFaninMax;
    int nCubesMax;
    pNtk = Abc_FrameReadNtk(pAbc);

    // set defaults
    fUseSop   =  1;
    fUseEsop  =  0;
    fVerbose  =  0;
    fUseInvs  =  1;
    nFaninMax =  8;
    nCubesMax =  8;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "IPsxivh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            nFaninMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFaninMax < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            nCubesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCubesMax < 0 )
                goto usage;
            break;
        case 's':
            fUseSop ^= 1;
            break;
        case 'x':
            fUseEsop ^= 1;
            break;
        case 'i':
            fUseInvs ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Only works for strashed networks.\n" );
        return 1;
    }

    // run the command
    pNtkRes = Abc_NtkSopEsopCover( pNtk, nFaninMax, nCubesMax, fUseEsop, fUseSop, fUseInvs, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Command has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: cover [-IP num] [-sxvh]\n" );
    Abc_Print( -2, "\t         decomposition into a network of SOP/ESOP PLAs\n" );
    Abc_Print( -2, "\t         (this command is known to have bugs)\n");
    Abc_Print( -2, "\t-I num : maximum number of inputs [default = %d]\n", nFaninMax );
    Abc_Print( -2, "\t-P num : maximum number of products [default = %d]\n", nCubesMax );
    Abc_Print( -2, "\t-s     : toggle the use of SOPs [default = %s]\n", fUseSop? "yes": "no" );
    Abc_Print( -2, "\t-x     : toggle the use of ESOPs [default = %s]\n", fUseEsop? "yes": "no" );
//    Abc_Print( -2, "\t-i     : toggle the use of interters [default = %s]\n", fUseInvs? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}